

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O0

DataPointer * __thiscall duckdb::ColumnSegment::GetDataPointer(ColumnSegment *this)

{
  uint uVar1;
  undefined8 uVar2;
  block_id_t bVar3;
  __atomic_base<unsigned_long> *this_00;
  __int_type _Var4;
  CompressionFunction *pCVar5;
  ColumnSegment *in_RSI;
  DataPointer *in_RDI;
  DataPointer *pointer;
  string *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  BaseStatistics *in_stack_ffffffffffffff18;
  DataPointer *in_stack_ffffffffffffff20;
  BaseStatistics *in_stack_ffffffffffffff58;
  string local_30 [48];
  
  if (in_RSI->segment_type == PERSISTENT) {
    BaseStatistics::Copy(in_stack_ffffffffffffff58);
    DataPointer::DataPointer(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    BaseStatistics::~BaseStatistics
              ((BaseStatistics *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    bVar3 = GetBlockId(in_RSI);
    (in_RDI->block_pointer).block_id = bVar3;
    this_00 = (__atomic_base<unsigned_long> *)GetBlockOffset(in_RSI);
    uVar1 = NumericCast<unsigned_int,unsigned_long,void>(0xb8cbac);
    (in_RDI->block_pointer).offset = uVar1;
    in_RDI->row_start = (in_RSI->super_SegmentBase<duckdb::ColumnSegment>).start;
    _Var4 = ::std::__atomic_base::operator_cast_to_unsigned_long(this_00);
    in_RDI->tuple_count = _Var4;
    pCVar5 = ::std::reference_wrapper<duckdb::CompressionFunction>::get(&in_RSI->function);
    in_RDI->compression_type = pCVar5->type;
    pCVar5 = ::std::reference_wrapper<duckdb::CompressionFunction>::get(&in_RSI->function);
    if (pCVar5->serialize_state != (compression_serialize_state_t)0x0) {
      pCVar5 = ::std::reference_wrapper<duckdb::CompressionFunction>::get(&in_RSI->function);
      (*pCVar5->serialize_state)((ColumnSegment *)&stack0xffffffffffffff58);
      unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
      ::operator=((unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
                   *)CONCAT44(uVar1,in_stack_ffffffffffffff10),
                  (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
                   *)in_stack_ffffffffffffff08);
      unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
      ::~unique_ptr((unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
                     *)0xb8cc61);
    }
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_30,"Attempting to call ColumnSegment::GetDataPointer on a transient segment",
             (allocator *)&stack0xffffffffffffffcf);
  InternalException::InternalException
            ((InternalException *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

DataPointer ColumnSegment::GetDataPointer() {
	if (segment_type != ColumnSegmentType::PERSISTENT) {
		throw InternalException("Attempting to call ColumnSegment::GetDataPointer on a transient segment");
	}
	// set up the data pointer directly using the data from the persistent segment
	DataPointer pointer(stats.statistics.Copy());
	pointer.block_pointer.block_id = GetBlockId();
	pointer.block_pointer.offset = NumericCast<uint32_t>(GetBlockOffset());
	pointer.row_start = start;
	pointer.tuple_count = count;
	pointer.compression_type = function.get().type;
	if (function.get().serialize_state) {
		pointer.segment_state = function.get().serialize_state(*this);
	}
	return pointer;
}